

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_2ab829::ImplPosix::StartReceivingTokens(ImplPosix *this)

{
  int status_00;
  uv_stream_t *stream;
  int status;
  ImplPosix *this_local;
  
  if ((this->Conn != None) && ((this->ReceivingTokens & 1U) == 0)) {
    stream = GetReader(this);
    status_00 = uv_read_start(stream,OnAllocateCB,OnReadCB);
    if (status_00 == 0) {
      this->ReceivingTokens = true;
    }
    else {
      Disconnect(this,status_00);
    }
  }
  return;
}

Assistant:

void ImplPosix::StartReceivingTokens()
{
  if (this->Conn == Connection::None) {
    return;
  }
  if (this->ReceivingTokens) {
    return;
  }

  int status = uv_read_start(this->GetReader(), &ImplPosix::OnAllocateCB,
                             &ImplPosix::OnReadCB);
  if (status != 0) {
    this->Disconnect(status);
    return;
  }

  this->ReceivingTokens = true;
}